

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

void insert<32000u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_short>,unsigned_short>
               (TrieNode<unsigned_short> *root,uchar **strings,size_t n)

{
  _WordT *p_Var1;
  uchar **ppuVar2;
  ulong uVar3;
  TrieNode<unsigned_short> *pTVar4;
  byte bVar5;
  size_t sVar6;
  uchar *puVar7;
  size_t depth;
  vector_brodnik<unsigned_char_*> *this;
  ulong uVar8;
  ulong uVar9;
  ushort uVar10;
  TrieNode<unsigned_short> *pTVar11;
  BurstSimple<unsigned_short> local_61;
  vector_brodnik<unsigned_char_*> *local_60;
  uchar *local_58;
  TrieNode<unsigned_short> *local_50;
  size_t local_48;
  uchar **local_40;
  size_t local_38;
  
  if (n != 0) {
    sVar6 = 0;
    local_50 = root;
    local_48 = n;
    local_40 = strings;
    do {
      puVar7 = local_40[sVar6];
      if (puVar7 == (uchar *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (*puVar7 == '\0') {
        uVar10 = 0;
      }
      else {
        uVar10 = CONCAT11(*puVar7,puVar7[1]);
      }
      uVar9 = (ulong)(uVar10 >> 6);
      uVar3 = (local_50->is_trie).super__Base_bitset<1024UL>._M_w[uVar9];
      bVar5 = (byte)uVar10;
      depth = 2;
      pTVar11 = local_50;
      while( true ) {
        uVar8 = (ulong)uVar10;
        local_38 = sVar6;
        if ((uVar3 >> (uVar8 & 0x3f) & 1) == 0) break;
        if ((char)uVar10 == '\0') {
          __assert_fail("not is_end(c)",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                        ,0xdf,
                        "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 32000U, BucketT = vector_brodnik<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                       );
        }
        if (puVar7[depth] == '\0') {
          uVar10 = 0;
        }
        else {
          uVar10 = CONCAT11(puVar7[depth],puVar7[depth + 1]);
        }
        pTVar11 = (TrieNode<unsigned_short> *)(pTVar11->buckets)._M_elems[uVar8];
        bVar5 = (byte)uVar10;
        uVar9 = (ulong)(uVar10 >> 6);
        uVar3 = (pTVar11->is_trie).super__Base_bitset<1024UL>._M_w[uVar9];
        depth = depth + 2;
      }
      this = (vector_brodnik<unsigned_char_*> *)(pTVar11->buckets)._M_elems[uVar8];
      if (this == (vector_brodnik<unsigned_char_*> *)0x0) {
        local_58 = puVar7;
        local_60 = (vector_brodnik<unsigned_char_*> *)operator_new(0x38);
        (local_60->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_60->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_60->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vector_brodnik<unsigned_char_*>::clear(local_60);
        (pTVar11->buckets)._M_elems[uVar8] = local_60;
        puVar7 = local_58;
        this = local_60;
      }
      if (this->_left_in_block == 0) {
        local_60 = this;
        local_58 = puVar7;
        vector_brodnik<unsigned_char_*>::grow(this);
        puVar7 = local_58;
        this = local_60;
      }
      ppuVar2 = this->_insertpos;
      this->_insertpos = ppuVar2 + 1;
      *ppuVar2 = puVar7;
      sVar6 = this->_left_in_block;
      this->_left_in_block = sVar6 - 1;
      if (((char)uVar10 != '\0') &&
         (32000 < ((long)(2 << (this->_superblock & 0x1f)) -
                  (sVar6 + (ulong)this->_left_in_superblock * this->_block_size)) - 0x3f)) {
        pTVar4 = BurstSimple<unsigned_short>::operator()(&local_61,this,depth);
        (pTVar11->buckets)._M_elems[uVar8] = pTVar4;
        p_Var1 = (pTVar11->is_trie).super__Base_bitset<1024UL>._M_w + uVar9;
        *p_Var1 = *p_Var1 | 1L << (bVar5 & 0x3f);
        vector_brodnik<unsigned_char_*>::~vector_brodnik(this);
        operator_delete(this);
      }
      sVar6 = local_38 + 1;
    } while (sVar6 != local_48);
  }
  return;
}

Assistant:

static inline void
insert(TrieNode<CharT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT>* node = root;
		while (node->is_trie[c]) {
			assert(not is_end(c));
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = static_cast<BucketT*>(node->buckets[c]);
		if (not bucket) {
			node->buckets[c] = bucket = new BucketT;
		}
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			node->is_trie[c] = true;
			delete bucket;
		}
	}
}